

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::CompactReporter::testRunEnded(CompactReporter *this,TestRunStats *_testRunStats)

{
  ostream *this_00;
  StreamingReporterBase<Catch::CompactReporter> *in_RSI;
  TestRunStats *in_RDI;
  Totals *in_stack_000003c8;
  ostream *in_stack_000003d0;
  
  anon_unknown_1::printTotals(in_stack_000003d0,in_stack_000003c8);
  this_00 = std::operator<<((ostream *)(in_RDI->runInfo).name.field_2._M_allocated_capacity,'\n');
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  StreamingReporterBase<Catch::CompactReporter>::testRunEnded(in_RSI,in_RDI);
  return;
}

Assistant:

void CompactReporter::testRunEnded( TestRunStats const& _testRunStats ) {
            printTotals( stream, _testRunStats.totals );
            stream << '\n' << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }